

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

string * __thiscall
kratos::SystemVerilogCodeGen::get_var_width_str_abi_cxx11_
          (string *__return_storage_ptr__,SystemVerilogCodeGen *this,Var *var)

{
  long *plVar1;
  int iVar2;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_78;
  undefined8 uStack_70;
  size_type *psStack_68;
  string width;
  
  psStack_68 = &width._M_string_length;
  width._M_dataplus._M_p = (pointer)0x0;
  width._M_string_length._0_1_ = 0;
  plVar1 = *(long **)&(this->stream_).super_stringstream.field_0x100;
  if (plVar1 == (long *)0x0) {
    std::__cxx11::to_string
              ((string *)((long)&width.field_2 + 8),
               *(int *)&(this->options_).package_name._M_dataplus._M_p - 1);
    this_00 = (string *)(width.field_2._M_local_buf + 8);
    std::__cxx11::string::operator=((string *)&psStack_68,this_00);
  }
  else {
    (**(code **)(*plVar1 + 0xf8))(&local_98);
    local_78 = local_98;
    uStack_70 = uStack_90;
    bVar3 = fmt::v7::to_string_view<char,_0>("{0}-1");
    format_str.data_ = (char *)bVar3.size_;
    format_str.size_ = 0xd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_78;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)((long)&width.field_2 + 8),(detail *)bVar3.data_,format_str,args);
    std::__cxx11::string::operator=
              ((string *)&psStack_68,(string *)(width.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(width.field_2._M_local_buf + 8));
    this_00 = (string *)&local_98;
  }
  std::__cxx11::string::~string(this_00);
  if (*(uint *)&(this->options_).package_name._M_dataplus._M_p < 2) {
LAB_00194452:
    if (*(long *)&(this->stream_).super_stringstream.field_0x100 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",
                 (allocator<char> *)(width.field_2._M_local_buf + 8));
      goto LAB_00194497;
    }
  }
  else {
    iVar2 = (*this->_vptr_SystemVerilogCodeGen[0x17])(this);
    if ((char)iVar2 != '\0') goto LAB_00194452;
  }
  width.field_2._8_8_ = psStack_68;
  bVar3 = fmt::v7::to_string_view<char,_0>("[{0}:0]");
  format_str_00.data_ = (char *)bVar3.size_;
  format_str_00.size_ = 0xd;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)((long)&width.field_2 + 8);
  fmt::v7::detail::vformat_abi_cxx11_
            (__return_storage_ptr__,(detail *)bVar3.data_,format_str_00,args_00);
LAB_00194497:
  std::__cxx11::string::~string((string *)&psStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemVerilogCodeGen::get_var_width_str(const Var* var) {
    std::string width;
    if (var->parametrized()) {
        width = ::format("{0}-1", var->width_param()->to_string());
    } else {
        width = std::to_string(var->var_width() - 1);
    }
    return (var->var_width() > 1 && !var->is_struct()) || var->parametrized()
               ? ::format("[{0}:0]", width)
               : "";
}